

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ShadowName(char *zName)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  while (zName == (char *)0x0) {
LAB_001c5c1b:
    lVar3 = lVar3 + 1;
    if (lVar3 == 5) {
      return 0;
    }
  }
  lVar4 = 0;
  do {
    bVar1 = zName[lVar4];
    bVar2 = *(byte *)((long)&fts5ShadowName_azName_rel +
                     (int)(&fts5ShadowName_azName_rel)[lVar3] + lVar4);
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) {
        return 1;
      }
    }
    else if (""[bVar1] != ""[bVar2]) goto LAB_001c5c1b;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static int fts5ShadowName(const char *zName){
  static const char *azName[] = {
    "config", "content", "data", "docsize", "idx"
  };
  unsigned int i;
  for(i=0; i<sizeof(azName)/sizeof(azName[0]); i++){
    if( sqlite3_stricmp(zName, azName[i])==0 ) return 1;
  }
  return 0;
}